

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
ProcessorGenerator::ProcessorGenerator
          (ProcessorGenerator *this,t_cpp_generator *generator,t_service *service,string *style)

{
  bool bVar1;
  t_service *ptVar2;
  ofstream_with_content_based_conditional_update *local_170;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_28;
  string *style_local;
  t_service *service_local;
  t_cpp_generator *generator_local;
  ProcessorGenerator *this_local;
  
  this->generator_ = generator;
  this->service_ = service;
  this->f_header_ = (ostream *)&generator->f_header_;
  if ((generator->gen_templates_ & 1U) == 0) {
    local_170 = &generator->f_service_;
  }
  else {
    local_170 = &generator->f_service_tcc_;
  }
  this->f_out_ = (ostream *)local_170;
  local_28 = style;
  style_local = (string *)service;
  service_local = (t_service *)generator;
  generator_local = (t_cpp_generator *)this;
  std::__cxx11::string::string
            ((string *)&this->service_name_,
             (string *)&(generator->super_t_oop_generator).super_t_generator.service_name_);
  std::__cxx11::string::string((string *)&this->style_,(string *)local_28);
  std::__cxx11::string::string((string *)&this->pstyle_);
  std::__cxx11::string::string((string *)&this->class_name_);
  std::__cxx11::string::string((string *)&this->if_name_);
  std::__cxx11::string::string((string *)&this->factory_class_name_);
  std::__cxx11::string::string((string *)&this->finish_cob_);
  std::__cxx11::string::string((string *)&this->finish_cob_decl_);
  std::__cxx11::string::string((string *)&this->ret_type_);
  std::__cxx11::string::string((string *)&this->call_context_);
  std::__cxx11::string::string((string *)&this->cob_arg_);
  std::__cxx11::string::string((string *)&this->call_context_arg_);
  std::__cxx11::string::string((string *)&this->call_context_decl_);
  std::__cxx11::string::string((string *)&this->template_header_);
  std::__cxx11::string::string((string *)&this->template_suffix_);
  std::__cxx11::string::string((string *)&this->typename_str_);
  std::__cxx11::string::string((string *)&this->class_suffix_);
  std::__cxx11::string::string((string *)&this->extends_);
  bVar1 = std::operator==(&this->style_,"Cob");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->pstyle_,"Async");
    std::operator+(&local_78,&this->service_name_,&this->pstyle_);
    std::operator+(&local_58,&local_78,"Processor");
    std::__cxx11::string::operator=((string *)&this->class_name_,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::operator+(&local_98,&this->service_name_,"CobSvIf");
    std::__cxx11::string::operator=((string *)&this->if_name_,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::operator=
              ((string *)&this->finish_cob_,"::std::function<void(bool ok)> cob, ");
    std::__cxx11::string::operator=
              ((string *)&this->finish_cob_decl_,"::std::function<void(bool ok)>, ");
    std::__cxx11::string::operator=((string *)&this->cob_arg_,"cob, ");
    std::__cxx11::string::operator=((string *)&this->ret_type_,"void ");
  }
  else {
    std::operator+(&local_b8,&this->service_name_,"Processor");
    std::__cxx11::string::operator=((string *)&this->class_name_,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::operator+(&local_d8,&this->service_name_,"If");
    std::__cxx11::string::operator=((string *)&this->if_name_,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::operator=((string *)&this->ret_type_,"bool ");
    std::__cxx11::string::operator=((string *)&this->call_context_,", void* callContext");
    std::__cxx11::string::operator=((string *)&this->call_context_arg_,", callContext");
    std::__cxx11::string::operator=((string *)&this->call_context_decl_,", void*");
  }
  std::operator+(&local_f8,&this->class_name_,"Factory");
  std::__cxx11::string::operator=((string *)&this->factory_class_name_,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if ((service_local[1].super_t_type.annotations_._M_t._M_impl.field_0x1 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)&this->template_header_,"template <class Protocol_>\n");
    std::__cxx11::string::operator=((string *)&this->template_suffix_,"<Protocol_>");
    std::__cxx11::string::operator=((string *)&this->typename_str_,"typename ");
    std::__cxx11::string::operator+=((string *)&this->class_name_,"T");
    std::__cxx11::string::operator+=((string *)&this->factory_class_name_,"T");
  }
  ptVar2 = t_service::get_extends(this->service_);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends(this->service_);
    type_name_abi_cxx11_(&local_158,this,&ptVar2->super_t_type,false,false);
    std::operator+(&local_138,&local_158,&this->pstyle_);
    std::operator+(&local_118,&local_138,"Processor");
    std::__cxx11::string::operator=((string *)&this->extends_,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    if ((this->generator_->gen_templates_ & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)&this->extends_,"T<Protocol_>");
    }
  }
  return;
}

Assistant:

ProcessorGenerator::ProcessorGenerator(t_cpp_generator* generator,
                                       t_service* service,
                                       const string& style)
  : generator_(generator),
    service_(service),
    f_header_(generator->f_header_),
    f_out_(generator->gen_templates_ ? generator->f_service_tcc_ : generator->f_service_),
    service_name_(generator->service_name_),
    style_(style) {
  if (style_ == "Cob") {
    pstyle_ = "Async";
    class_name_ = service_name_ + pstyle_ + "Processor";
    if_name_ = service_name_ + "CobSvIf";

    finish_cob_ = "::std::function<void(bool ok)> cob, ";
    finish_cob_decl_ = "::std::function<void(bool ok)>, ";
    cob_arg_ = "cob, ";
    ret_type_ = "void ";
  } else {
    class_name_ = service_name_ + "Processor";
    if_name_ = service_name_ + "If";

    ret_type_ = "bool ";
    // TODO(edhall) callContext should eventually be added to TAsyncProcessor
    call_context_ = ", void* callContext";
    call_context_arg_ = ", callContext";
    call_context_decl_ = ", void*";
  }

  factory_class_name_ = class_name_ + "Factory";

  if (generator->gen_templates_) {
    template_header_ = "template <class Protocol_>\n";
    template_suffix_ = "<Protocol_>";
    typename_str_ = "typename ";
    class_name_ += "T";
    factory_class_name_ += "T";
  }

  if (service_->get_extends() != nullptr) {
    extends_ = type_name(service_->get_extends()) + pstyle_ + "Processor";
    if (generator_->gen_templates_) {
      // TODO(simpkins): If gen_templates_ is enabled, we currently assume all
      // parent services were also generated with templates enabled.
      extends_ += "T<Protocol_>";
    }
  }
}